

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O1

void * create_socket(void *context,int use_tcp)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  
  pvVar2 = (void *)zmq_socket(context,4);
  if (pvVar2 == (void *)0x0) {
    throw("Error creating socket");
  }
  pcVar3 = "tcp://*:6969";
  if (use_tcp == 0) {
    pcVar3 = "ipc:///tmp/zmq_ipc";
  }
  iVar1 = zmq_bind(pvVar2,pcVar3);
  if (iVar1 != -1) {
    return pvVar2;
  }
  throw("Error binding socket to address");
}

Assistant:

void* create_socket(void* context, int use_tcp) {
	// The socket we will create.
	void* socket;
	const char* address;

	// Create a new zmq socket. Note that this is not necessarily
	// a socket in the traditional sense, i.e. that performs
	// network or UNIX-domain I/O. It is just the name ZMQ gives
	// to any of its "connected nodes". The final transmission
	// medium is chosen later, in the call to bind().
	// The second argument to the function specifies the network
	// architecture/pattern of the message queue and this socket's
	// role in that pattern. For example, we will use the simple
	// reply-request model for our server/client pair. In this
	// pattern, there is one (or more) replying node (the server),
	// who thus passes ZMQ_REP, and one (or more) requesting nodes
	// (the client), who passes ZMQ_REQ.
	if ((socket = zmq_socket(context, ZMQ_REP)) == NULL) {
		throw("Error creating socket");
	}

	address = use_tcp ? "tcp://*:6969" : "ipc:///tmp/zmq_ipc";

	// This is the call that actually binds the "universal"
	// socket to a transport medium and associated address.
	// In this case, we bind it to TCP port 6969. We could
	// also bind it to a UNIX-domain socket, for example.
	if (zmq_bind(socket, address) == -1) {
		throw("Error binding socket to address");
	}

	return socket;
}